

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# y4m_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_d7b29e::Y4mVideoWriteTest_WriteTest_Test::TestBody
          (Y4mVideoWriteTest_WriteTest_Test *this)

{
  char *pcVar1;
  ParamType *pPVar2;
  long *in_RDI;
  string *in_stack_00000078;
  Y4mVideoSourceTest *in_stack_00000080;
  Y4mTestParam t;
  aom_img_fmt_t in_stack_00000348;
  uint in_stack_0000034c;
  Y4mVideoSourceTest *in_stack_00000350;
  allocator local_81;
  string local_80 [55];
  allocator local_49;
  string local_48 [32];
  char *local_28;
  undefined8 uStack_20;
  char *local_18;
  
  pPVar2 = testing::WithParamInterface<(anonymous_namespace)::Y4mTestParam>::GetParam();
  local_18 = pPVar2->md5raw;
  pcVar1 = pPVar2->filename;
  uStack_20._0_4_ = pPVar2->bit_depth;
  uStack_20._4_4_ = pPVar2->format;
  local_28 = pcVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,pcVar1,&local_49);
  (**(code **)(*in_RDI + 0x30))(in_RDI,local_48,10);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  Y4mVideoSourceTest::HeaderChecks(in_stack_00000350,in_stack_0000034c,in_stack_00000348);
  pcVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,pcVar1,&local_81);
  Y4mVideoSourceTest::Md5Check(in_stack_00000080,in_stack_00000078);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  return;
}

Assistant:

TEST_P(Y4mVideoWriteTest, WriteTest) {
  const Y4mTestParam t = GetParam();
  Init(t.filename, kFrames);
  HeaderChecks(t.bit_depth, t.format);
  Md5Check(t.md5raw);
}